

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O0

int wally_init(uint32_t flags)

{
  undefined4 local_c;
  uint32_t flags_local;
  
  if (flags == 0) {
    if (!wally_init_done) {
      sha256_optimize();
      wally_init_done = true;
    }
    local_c = 0;
  }
  else {
    local_c = -2;
  }
  return local_c;
}

Assistant:

int wally_init(uint32_t flags)
{
    if (flags)
        return WALLY_EINVAL;

    if (!wally_init_done) {
        sha256_optimize();
        wally_init_done = true;
    }

    return WALLY_OK;
}